

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QFileInfo>::emplace<QFileInfo_const&>
          (QMovableArrayOps<QFileInfo> *this,qsizetype i,QFileInfo *args)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QFileInfo *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QFileInfo tmp;
  QFileInfo *in_stack_ffffffffffffff78;
  Inserter *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined1 uVar4;
  GrowthPosition in_stack_ffffffffffffff9c;
  QArrayDataPointer<QFileInfo> *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QArrayDataPointer<QFileInfo>::needsDetach
                    ((QArrayDataPointer<QFileInfo> *)in_stack_ffffffffffffff80);
  if (!bVar2) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<QFileInfo>::freeSpaceAtEnd
                          ((QArrayDataPointer<QFileInfo> *)
                           CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)),
       qVar3 != 0)) {
      QArrayDataPointer<QFileInfo>::end((QArrayDataPointer<QFileInfo> *)in_stack_ffffffffffffff80);
      QFileInfo::QFileInfo((QFileInfo *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      in_RDI->displaceTo = (QFileInfo *)((long)&(in_RDI->displaceTo->d_ptr).d.ptr + 1);
      goto LAB_0028ce33;
    }
    if ((in_RSI == (QFileInfo *)0x0) &&
       (qVar3 = QArrayDataPointer<QFileInfo>::freeSpaceAtBegin
                          ((QArrayDataPointer<QFileInfo> *)
                           CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)),
       qVar3 != 0)) {
      QArrayDataPointer<QFileInfo>::begin((QArrayDataPointer<QFileInfo> *)0x28ccda);
      QFileInfo::QFileInfo((QFileInfo *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QFileInfo *)((long)&(in_RDI->displaceTo->d_ptr).d.ptr + 1);
      goto LAB_0028ce33;
    }
  }
  QFileInfo::QFileInfo((QFileInfo *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  bVar2 = in_RDI->displaceTo != (QFileInfo *)0x0;
  uVar4 = bVar2 && in_RSI == (QFileInfo *)0x0;
  QArrayDataPointer<QFileInfo>::detachAndGrow
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(qsizetype)in_RDI,
             (QFileInfo **)CONCAT17(uVar4,in_stack_ffffffffffffff88),
             (QArrayDataPointer<QFileInfo> *)in_stack_ffffffffffffff80);
  if (bVar2 && in_RSI == (QFileInfo *)0x0) {
    QArrayDataPointer<QFileInfo>::begin((QArrayDataPointer<QFileInfo> *)0x28cd8d);
    QFileInfo::QFileInfo((QFileInfo *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QFileInfo *)((long)&(in_RDI->displaceTo->d_ptr).d.ptr + 1);
  }
  else {
    Inserter::Inserter(in_RDI,(QArrayDataPointer<QFileInfo> *)
                              CONCAT17(uVar4,in_stack_ffffffffffffff88),
                       (qsizetype)in_stack_ffffffffffffff80,(qsizetype)in_stack_ffffffffffffff78);
    Inserter::insertOne(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    Inserter::~Inserter(in_RDI);
  }
  QFileInfo::~QFileInfo((QFileInfo *)0x28ce33);
LAB_0028ce33:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }